

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall cxxopts::OptionException::~OptionException(OptionException *this)

{
  OptionException *this_local;
  
  ~OptionException(this);
  operator_delete(this);
  return;
}

Assistant:

explicit OptionException(std::string  message)
    : m_message(std::move(message))
    {
    }